

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O1

mraa_result_t mraa_gpio_chardev_edge_mode(mraa_gpio_context dev,mraa_gpio_edge_t mode)

{
  int iVar1;
  int *piVar2;
  mraa_result_t mVar3;
  ulong uVar4;
  ulong uVar5;
  _gpio_group *p_Var6;
  gpioevent_request req;
  uint local_60 [11];
  int local_34;
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"gpio: edge_mode: context is invalid");
    mVar3 = MRAA_ERROR_INVALID_HANDLE;
  }
  else if (plat->chardev_capable == 0) {
    syslog(3,"mraa_gpio_chardev_edge_mode() not supported for old sysfs interface");
    mVar3 = MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
  }
  else {
    mVar3 = MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    if (mode - MRAA_GPIO_EDGE_BOTH < 3) {
      local_60[2] = *(uint *)(&DAT_00124a48 + (ulong)(mode - MRAA_GPIO_EDGE_BOTH) * 4);
      if (dev->num_chips == 0) {
        mVar3 = MRAA_SUCCESS;
      }
      else {
        mVar3 = MRAA_SUCCESS;
        uVar5 = 0;
        do {
          if (dev->gpio_group == (_gpio_group *)0x0) {
            return MRAA_SUCCESS;
          }
          p_Var6 = dev->gpio_group + uVar5;
          if (p_Var6->is_required != 0) {
            if (p_Var6->gpiod_handle != -1) {
              close(p_Var6->gpiod_handle);
              p_Var6->gpiod_handle = -1;
            }
            piVar2 = (int *)malloc((ulong)p_Var6->num_gpio_lines << 2);
            p_Var6->event_handles = piVar2;
            if (piVar2 == (int *)0x0) {
              syslog(3,"mraa_gpio_chardev_edge_mode(): malloc error!");
              return MRAA_ERROR_NO_RESOURCES;
            }
            if (p_Var6->num_gpio_lines != 0) {
              uVar4 = 0;
              do {
                local_60[0] = p_Var6->gpio_lines[uVar4];
                local_60[1] = 1;
                iVar1 = _mraa_gpiod_ioctl(p_Var6->dev_fd,0xc030b404,local_60);
                if (iVar1 < 0) {
                  syslog(3,"error getting line event handle for line %i",
                         (ulong)p_Var6->gpio_lines[uVar4]);
                  return MRAA_ERROR_INVALID_RESOURCE;
                }
                p_Var6->event_handles[uVar4] = local_34;
                uVar4 = uVar4 + 1;
              } while (uVar4 < p_Var6->num_gpio_lines);
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < dev->num_chips);
      }
    }
  }
  return mVar3;
}

Assistant:

mraa_result_t
mraa_gpio_chardev_edge_mode(mraa_gpio_context dev, mraa_gpio_edge_t mode)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "gpio: edge_mode: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (!plat->chardev_capable) {
        syslog(LOG_ERR, "mraa_gpio_chardev_edge_mode() not supported for old sysfs interface");
        return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    }

    int status;
    mraa_gpiod_group_t gpio_group;

    struct gpioevent_request req;

    switch (mode) {
        case MRAA_GPIO_EDGE_BOTH:
            req.eventflags = GPIOEVENT_REQUEST_BOTH_EDGES;
            break;
        case MRAA_GPIO_EDGE_RISING:
            req.eventflags = GPIOEVENT_REQUEST_RISING_EDGE;
            break;
        case MRAA_GPIO_EDGE_FALLING:
            req.eventflags = GPIOEVENT_REQUEST_FALLING_EDGE;
            break;
        /* Chardev interface doesn't handle EDGE_NONE. */
        case MRAA_GPIO_EDGE_NONE:
        default:
            return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    }

    for_each_gpio_group(gpio_group, dev)
    {
        if (gpio_group->gpiod_handle != -1) {
            close(gpio_group->gpiod_handle);
            gpio_group->gpiod_handle = -1;
        }

        gpio_group->event_handles = malloc(gpio_group->num_gpio_lines * sizeof(int));
        if (!gpio_group->event_handles) {
            syslog(LOG_ERR, "mraa_gpio_chardev_edge_mode(): malloc error!");
            return MRAA_ERROR_NO_RESOURCES;
        }

        for (int i = 0; i < gpio_group->num_gpio_lines; ++i) {
            req.lineoffset = gpio_group->gpio_lines[i];
            req.handleflags = GPIOHANDLE_REQUEST_INPUT;

            status = _mraa_gpiod_ioctl(gpio_group->dev_fd, GPIO_GET_LINEEVENT_IOCTL, &req);
            if (status < 0) {
                syslog(LOG_ERR, "error getting line event handle for line %i", gpio_group->gpio_lines[i]);
                return MRAA_ERROR_INVALID_RESOURCE;
            }

            gpio_group->event_handles[i] = req.fd;
        }
    }

    return MRAA_SUCCESS;
}